

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void pbrt::ErrorExit<unsigned_long>(char *fmt,unsigned_long *args)

{
  char *message;
  FileLoc *in_stack_ffffffffffffffc0;
  char local_30 [16];
  unsigned_long *in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  message = local_30;
  StringPrintf<unsigned_long>(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::__cxx11::string::c_str();
  ErrorExit(in_stack_ffffffffffffffc0,message);
}

Assistant:

[[noreturn]] inline void ErrorExit(const char *fmt, Args &&... args) {
    ErrorExit(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}